

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.h
# Opt level: O2

void __thiscall
flow::lang::CallExpr::CallExpr
          (CallExpr *this,SourceLocation *loc,CallableSym *callee,ParamList *args)

{
  Expr::Expr(&this->super_Expr,loc);
  (this->super_Expr).super_ASTNode._vptr_ASTNode = (_func_int **)&PTR__CallExpr_001aecb0;
  this->callee_ = callee;
  ParamList::ParamList(&this->args_,args);
  return;
}

Assistant:

CallExpr(const SourceLocation& loc, CallableSym* callee, ParamList&& args)
      : Expr(loc), callee_(callee), args_(std::move(args)) {}